

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop_repository_basis.cpp
# Opt level: O3

void __thiscall
so_5::impl::coop_repository_details::deregistration_processor_t::collect_and_modity_coop_info
          (deregistration_processor_t *this,coop_ref_t *root_coop)

{
  std::vector<std::shared_ptr<so_5::coop_t>,_std::allocator<std::shared_ptr<so_5::coop_t>_>_>::
  push_back(&this->m_coops_to_dereg,root_coop);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_coops_names_to_process,this->m_root_coop_name);
  collect_coops(this);
  modify_registered_and_deregistered_maps(this);
  return;
}

Assistant:

void
deregistration_processor_t::collect_and_modity_coop_info(
	const coop_ref_t & root_coop )
{
	// Exceptions must lead to abort at this deregistration stage.
	try
	{
		m_coops_to_dereg.push_back( root_coop );
		m_coops_names_to_process.push_back( m_root_coop_name );

		collect_coops();

		modify_registered_and_deregistered_maps();
	}
	catch( const std::exception & x )
	{
		initiate_abort_on_exception( x );
	}
}